

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdb.c
# Opt level: O1

int mdb_page_merge(MDB_cursor *csrc,MDB_cursor *cdst)

{
  byte *pbVar1;
  long *plVar2;
  indx_t *piVar3;
  ushort uVar4;
  unsigned_short uVar5;
  uint16_t uVar6;
  MDB_page *pMVar7;
  MDB_txn *pMVar8;
  MDB_ID2L ids;
  MDB_xcursor *pMVar9;
  MDB_page *pMVar10;
  bool bVar11;
  bool bVar12;
  ushort uVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  ulong uVar17;
  MDB_xcursor *pMVar18;
  short sVar19;
  uint uVar20;
  MDB_ID MVar21;
  MDB_xcursor *pMVar22;
  int in_R8D;
  uint6 *puVar23;
  MDB_val key;
  MDB_val data;
  MDB_cursor mn;
  MDB_val local_1f8;
  MDB_ID2L local_1e8;
  MDB_ID local_1e0;
  MDB_cursor *local_1d8;
  MDB_page *local_1d0;
  MDB_val local_1c8;
  MDB_cursor local_1b8;
  
  if (csrc->mc_snum < 2) {
    mdb_assert_fail(csrc->mc_txn->mt_env,"csrc->mc_snum > 1","mdb_page_merge",(char *)0x21e6,in_R8D)
    ;
  }
  if (cdst->mc_snum < 2) {
    mdb_assert_fail(csrc->mc_txn->mt_env,"cdst->mc_snum > 1","mdb_page_merge",(char *)0x21e7,in_R8D)
    ;
  }
  pMVar7 = csrc->mc_pg[csrc->mc_top];
  iVar14 = mdb_page_touch(cdst);
  if (iVar14 != 0) {
    return iVar14;
  }
  local_1d0 = cdst->mc_pg[cdst->mc_top];
  sVar19 = (short)((local_1d0->mp_pb).pb.pb_lower + 0x1fff0 >> 1);
  if ((pMVar7->mp_flags & 0x20) == 0) {
    if (((pMVar7->mp_pb).pb.pb_lower & 0xfffe) != 0x10) {
      uVar13 = 0;
      local_1d8 = cdst;
      do {
        puVar23 = (uint6 *)((long)pMVar7->mp_ptrs + ((ulong)pMVar7->mp_ptrs[uVar13] - 0x10));
        if ((uVar13 == 0) && ((pMVar7->mp_flags & 1) != 0)) {
          mdb_cursor_copy(csrc,&local_1b8);
          cdst = local_1d8;
          local_1b8.mc_xcursor = (MDB_xcursor *)0x0;
          iVar15 = mdb_page_search_lowest(&local_1b8);
          iVar14 = iVar15;
          if (iVar15 == 0) {
            pMVar10 = local_1b8.mc_pg[local_1b8.mc_top];
            if ((pMVar10->mp_flags & 0x20) == 0) {
              local_1f8.mv_data =
                   (void *)((long)pMVar10->mp_ptrs + ((ulong)pMVar10->mp_ptrs[0] - 8));
              local_1f8.mv_size =
                   (size_t)*(ushort *)((long)pMVar10->mp_ptrs + ((ulong)pMVar10->mp_ptrs[0] - 10));
            }
            else {
              local_1f8.mv_size = (size_t)(local_1b8.mc_db)->md_pad;
              local_1f8.mv_data = pMVar10->mp_ptrs;
            }
            iVar14 = (int)local_1e8;
          }
          local_1e8 = (MDB_ID2L)CONCAT44(local_1e8._4_4_,iVar14);
          if (iVar15 != 0) {
            return iVar14;
          }
        }
        else {
          local_1f8.mv_size = (size_t)*(ushort *)((long)puVar23 + 6);
          local_1f8.mv_data = puVar23 + 1;
        }
        local_1c8.mv_size = (size_t)(uint)*puVar23;
        local_1c8.mv_data = (void *)((long)puVar23 + (ulong)*(ushort *)((long)puVar23 + 6) + 8);
        iVar14 = mdb_node_add(cdst,uVar13 + sVar19,&local_1f8,&local_1c8,(ulong)*puVar23,
                              (uint)*(ushort *)((long)puVar23 + 4));
        if (iVar14 != 0) {
          return iVar14;
        }
        uVar13 = uVar13 + 1;
      } while ((uint)uVar13 < (pMVar7->mp_pb).pb.pb_lower - 0x10 >> 1);
    }
  }
  else {
    local_1f8.mv_size = (size_t)csrc->mc_db->md_pad;
    local_1f8.mv_data = pMVar7->mp_ptrs;
    if (((pMVar7->mp_pb).pb.pb_lower & 0xfffe) != 0x10) {
      uVar13 = 1;
      do {
        iVar14 = mdb_node_add(cdst,sVar19 + -1 + uVar13,&local_1f8,(MDB_val *)0x0,0,0);
        if (iVar14 != 0) {
          return iVar14;
        }
        local_1f8.mv_data = (void *)((long)local_1f8.mv_data + local_1f8.mv_size);
        uVar16 = (uint)uVar13;
        uVar13 = uVar13 + 1;
      } while (uVar16 < (pMVar7->mp_pb).pb.pb_lower - 0x10 >> 1);
    }
  }
  csrc->mc_top = csrc->mc_top - 1;
  bVar12 = false;
  mdb_node_del(csrc,0);
  if (csrc->mc_ki[csrc->mc_top] == 0) {
    local_1f8.mv_size = 0;
    iVar14 = mdb_update_key(csrc,&local_1f8);
    if (iVar14 != 0) {
      csrc->mc_top = csrc->mc_top + 1;
      return iVar14;
    }
  }
  uVar13 = csrc->mc_top + 1;
  csrc->mc_top = uVar13;
  pMVar7 = csrc->mc_pg[uVar13];
  MVar21 = (pMVar7->mp_p).p_pgno;
  pMVar8 = csrc->mc_txn;
  if (((pMVar7->mp_flags & 0x10) != 0) && (csrc->mc_dbi != 0)) {
    if (pMVar8->mt_parent == (MDB_txn *)0x0) {
      bVar12 = true;
    }
    else {
      ids = (pMVar8->mt_u).dirty_list;
      bVar11 = true;
      bVar12 = false;
      if (ids->mid != 0) {
        local_1e8 = ids;
        local_1e0 = MVar21;
        uVar16 = mdb_mid2l_search(ids,MVar21);
        uVar17 = (ulong)uVar16;
        MVar21 = local_1e0;
        if ((local_1e8->mid < uVar17) || (local_1e8[uVar17].mid != local_1e0)) {
          bVar11 = true;
        }
        else {
          bVar11 = true;
          if ((MDB_page *)local_1e8[uVar17].mptr == pMVar7) {
            bVar12 = true;
          }
          else {
            *(byte *)&csrc->mc_flags = (byte)csrc->mc_flags & 0xfc;
            *(byte *)&pMVar8->mt_flags = (byte)pMVar8->mt_flags | 2;
            bVar12 = false;
            bVar11 = false;
          }
        }
      }
      iVar14 = -0x784c;
      if (!bVar11) goto LAB_0010dd62;
    }
  }
  if (bVar12) {
    pMVar7[2].mp_p = (anon_union_8_2_b62042e6_for_mp_p)pMVar8->mt_loose_pgs;
    pMVar8->mt_loose_pgs = pMVar7;
    pMVar8->mt_loose_count = pMVar8->mt_loose_count + 1;
    pbVar1 = (byte *)((long)&pMVar7->mp_flags + 1);
    *pbVar1 = *pbVar1 | 0x40;
  }
  else {
    iVar14 = mdb_midl_append(&pMVar8->mt_free_pgs,MVar21);
    if (iVar14 != 0) goto LAB_0010dd62;
  }
  iVar14 = 0;
LAB_0010dd62:
  if (iVar14 == 0) {
    plVar2 = (long *)((long)&csrc->mc_db->md_branch_pages + (ulong)(pMVar7->mp_flags & 2) * 4);
    *plVar2 = *plVar2 + -1;
    pMVar18 = (MDB_xcursor *)csrc->mc_txn->mt_cursors[csrc->mc_dbi];
    if (pMVar18 != (MDB_xcursor *)0x0) {
      uVar13 = csrc->mc_top;
      uVar16 = csrc->mc_flags;
      uVar20 = uVar13 - 1;
      do {
        pMVar22 = pMVar18;
        if ((uVar16 & 4) != 0) {
          pMVar22 = (pMVar18->mx_cursor).mc_xcursor;
        }
        if ((pMVar22 != (MDB_xcursor *)csrc) && (csrc->mc_snum <= (pMVar22->mx_cursor).mc_snum)) {
          if ((pMVar22->mx_cursor).mc_pg[uVar13] == pMVar7) {
            (pMVar22->mx_cursor).mc_pg[uVar13] = local_1d0;
            piVar3 = (pMVar22->mx_cursor).mc_ki + uVar13;
            *piVar3 = *piVar3 + sVar19;
            (pMVar22->mx_cursor).mc_ki[uVar20] = cdst->mc_ki[uVar20];
          }
          else if (((pMVar22->mx_cursor).mc_pg[uVar20] == csrc->mc_pg[uVar20]) &&
                  (uVar4 = (pMVar22->mx_cursor).mc_ki[uVar20], csrc->mc_ki[uVar20] < uVar4)) {
            (pMVar22->mx_cursor).mc_ki[uVar20] = uVar4 - 1;
          }
          pMVar9 = (pMVar22->mx_cursor).mc_xcursor;
          if (((pMVar9 != (MDB_xcursor *)0x0) && (((pMVar9->mx_cursor).mc_flags & 1) != 0)) &&
             ((pMVar7->mp_flags & 2) != 0)) {
            pMVar10 = (pMVar22->mx_cursor).mc_pg[uVar13];
            uVar17 = (ulong)pMVar10->mp_ptrs[(pMVar22->mx_cursor).mc_ki[uVar13]];
            if ((*(ushort *)((long)pMVar10->mp_ptrs + (uVar17 - 0xc)) & 6) == 4) {
              (pMVar9->mx_cursor).mc_pg[0] =
                   (MDB_page *)
                   ((long)pMVar10->mp_ptrs +
                   *(ushort *)((long)pMVar10->mp_ptrs + (uVar17 - 10)) + uVar17 + -8);
            }
          }
        }
        pMVar18 = (MDB_xcursor *)(pMVar18->mx_cursor).mc_next;
      } while (pMVar18 != (MDB_xcursor *)0x0);
    }
    uVar5 = cdst->mc_snum;
    uVar6 = cdst->mc_db->md_depth;
    if (uVar5 != 0) {
      cdst->mc_snum = uVar5 - 1;
      if ((unsigned_short)(uVar5 - 1) == 0) {
        *(byte *)&cdst->mc_flags = (byte)cdst->mc_flags & 0xfe;
      }
      else {
        cdst->mc_top = cdst->mc_top - 1;
      }
    }
    iVar14 = mdb_rebalance(cdst);
    sVar19 = cdst->mc_db->md_depth - uVar6;
    cdst->mc_snum = sVar19 + uVar5;
    cdst->mc_top = (sVar19 + uVar5) - 1;
  }
  return iVar14;
}

Assistant:

static int
mdb_page_merge(MDB_cursor *csrc, MDB_cursor *cdst)
{
	MDB_page	*psrc, *pdst;
	MDB_node	*srcnode;
	MDB_val		 key, data;
	unsigned	 nkeys;
	int			 rc;
	indx_t		 i, j;

	psrc = csrc->mc_pg[csrc->mc_top];
	pdst = cdst->mc_pg[cdst->mc_top];

	DPRINTF(("merging page %"Y"u into %"Y"u", psrc->mp_pgno, pdst->mp_pgno));

	mdb_cassert(csrc, csrc->mc_snum > 1);	/* can't merge root page */
	mdb_cassert(csrc, cdst->mc_snum > 1);

	/* Mark dst as dirty. */
	if ((rc = mdb_page_touch(cdst)))
		return rc;

	/* get dst page again now that we've touched it. */
	pdst = cdst->mc_pg[cdst->mc_top];

	/* Move all nodes from src to dst.
	 */
	j = nkeys = NUMKEYS(pdst);
	if (IS_LEAF2(psrc)) {
		key.mv_size = csrc->mc_db->md_pad;
		key.mv_data = METADATA(psrc);
		for (i = 0; i < NUMKEYS(psrc); i++, j++) {
			rc = mdb_node_add(cdst, j, &key, NULL, 0, 0);
			if (rc != MDB_SUCCESS)
				return rc;
			key.mv_data = (char *)key.mv_data + key.mv_size;
		}
	} else {
		for (i = 0; i < NUMKEYS(psrc); i++, j++) {
			srcnode = NODEPTR(psrc, i);
			if (i == 0 && IS_BRANCH(psrc)) {
				MDB_cursor mn;
				MDB_node *s2;
				mdb_cursor_copy(csrc, &mn);
				mn.mc_xcursor = NULL;
				/* must find the lowest key below src */
				rc = mdb_page_search_lowest(&mn);
				if (rc)
					return rc;
				if (IS_LEAF2(mn.mc_pg[mn.mc_top])) {
					key.mv_size = mn.mc_db->md_pad;
					key.mv_data = LEAF2KEY(mn.mc_pg[mn.mc_top], 0, key.mv_size);
				} else {
					s2 = NODEPTR(mn.mc_pg[mn.mc_top], 0);
					key.mv_size = NODEKSZ(s2);
					key.mv_data = NODEKEY(s2);
				}
			} else {
				key.mv_size = srcnode->mn_ksize;
				key.mv_data = NODEKEY(srcnode);
			}

			data.mv_size = NODEDSZ(srcnode);
			data.mv_data = NODEDATA(srcnode);
			rc = mdb_node_add(cdst, j, &key, &data, NODEPGNO(srcnode), srcnode->mn_flags);
			if (rc != MDB_SUCCESS)
				return rc;
		}
	}

	DPRINTF(("dst page %"Y"u now has %u keys (%.1f%% filled)",
	    pdst->mp_pgno, NUMKEYS(pdst),
		(float)PAGEFILL(cdst->mc_txn->mt_env, pdst) / 10));

	/* Unlink the src page from parent and add to free list.
	 */
	csrc->mc_top--;
	mdb_node_del(csrc, 0);
	if (csrc->mc_ki[csrc->mc_top] == 0) {
		key.mv_size = 0;
		rc = mdb_update_key(csrc, &key);
		if (rc) {
			csrc->mc_top++;
			return rc;
		}
	}
	csrc->mc_top++;

	psrc = csrc->mc_pg[csrc->mc_top];
	/* If not operating on FreeDB, allow this page to be reused
	 * in this txn. Otherwise just add to free list.
	 */
	rc = mdb_page_loose(csrc, psrc);
	if (rc)
		return rc;
	if (IS_LEAF(psrc))
		csrc->mc_db->md_leaf_pages--;
	else
		csrc->mc_db->md_branch_pages--;
	{
		/* Adjust other cursors pointing to mp */
		MDB_cursor *m2, *m3;
		MDB_dbi dbi = csrc->mc_dbi;
		unsigned int top = csrc->mc_top;

		for (m2 = csrc->mc_txn->mt_cursors[dbi]; m2; m2=m2->mc_next) {
			if (csrc->mc_flags & C_SUB)
				m3 = &m2->mc_xcursor->mx_cursor;
			else
				m3 = m2;
			if (m3 == csrc) continue;
			if (m3->mc_snum < csrc->mc_snum) continue;
			if (m3->mc_pg[top] == psrc) {
				m3->mc_pg[top] = pdst;
				m3->mc_ki[top] += nkeys;
				m3->mc_ki[top-1] = cdst->mc_ki[top-1];
			} else if (m3->mc_pg[top-1] == csrc->mc_pg[top-1] &&
				m3->mc_ki[top-1] > csrc->mc_ki[top-1]) {
				m3->mc_ki[top-1]--;
			}
			if (m3->mc_xcursor && (m3->mc_xcursor->mx_cursor.mc_flags & C_INITIALIZED) &&
				IS_LEAF(psrc)) {
				MDB_node *node = NODEPTR(m3->mc_pg[top], m3->mc_ki[top]);
				if ((node->mn_flags & (F_DUPDATA|F_SUBDATA)) == F_DUPDATA)
					m3->mc_xcursor->mx_cursor.mc_pg[0] = NODEDATA(node);
			}
		}
	}
	{
		unsigned int snum = cdst->mc_snum;
		uint16_t depth = cdst->mc_db->md_depth;
		mdb_cursor_pop(cdst);
		rc = mdb_rebalance(cdst);
		/* Did the tree height change? */
		if (depth != cdst->mc_db->md_depth)
			snum += cdst->mc_db->md_depth - depth;
		cdst->mc_snum = snum;
		cdst->mc_top = snum-1;
	}
	return rc;
}